

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O3

Id __thiscall
dxil_spv::Converter::Impl::create_bindless_heap_variable(Impl *this,BindlessInfo *info)

{
  pointer *ppBVar1;
  ResourceKind RVar2;
  RawType RVar3;
  RawVecSize RVar4;
  BindlessResource *pBVar5;
  pointer ptr;
  iterator __position;
  bool bVar6;
  ComponentType CVar7;
  Id IVar8;
  uint uVar9;
  Id IVar10;
  Dim dim;
  long lVar11;
  Builder *pBVar12;
  Builder *this_00;
  mapped_type *pmVar13;
  LoggingCallback p_Var14;
  void *pvVar15;
  byte bVar16;
  long lVar17;
  uint uVar18;
  StorageClass storage;
  Decoration decoration;
  uint range_size;
  __normal_iterator<dxil_spv::Converter::Impl::BindlessResource_*,_std::vector<dxil_spv::Converter::Impl::BindlessResource,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>_>_>
  __it;
  __normal_iterator<dxil_spv::Converter::Impl::BindlessResource_*,_std::vector<dxil_spv::Converter::Impl::BindlessResource,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>_>_>
  _Var19;
  bool ms;
  uint vecsize;
  pointer pBVar20;
  ImageFormat format;
  BindlessResource local_1068;
  char buffer [4096];
  
  __it._M_current =
       (this->bindless_resources).
       super__Vector_base<dxil_spv::Converter::Impl::BindlessResource,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pBVar5 = (this->bindless_resources).
           super__Vector_base<dxil_spv::Converter::Impl::BindlessResource,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar11 = (long)pBVar5 - (long)__it._M_current;
  lVar17 = (lVar11 >> 3) * -0x3333333333333333 >> 2;
  if (0 < lVar17) {
    pBVar20 = __it._M_current + lVar17 * 4;
    lVar17 = lVar17 + 1;
    do {
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<dxil_spv::Converter::Impl::create_bindless_heap_variable(dxil_spv::Converter::Impl::BindlessInfo_const&)::$_0>
              ::operator()((_Iter_pred<dxil_spv::Converter::Impl::create_bindless_heap_variable(dxil_spv::Converter::Impl::BindlessInfo_const&)::__0>
                            *)info,__it);
      _Var19._M_current = __it._M_current;
      if (bVar6) goto LAB_00112356;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<dxil_spv::Converter::Impl::create_bindless_heap_variable(dxil_spv::Converter::Impl::BindlessInfo_const&)::$_0>
              ::operator()((_Iter_pred<dxil_spv::Converter::Impl::create_bindless_heap_variable(dxil_spv::Converter::Impl::BindlessInfo_const&)::__0>
                            *)info,__it._M_current + 1);
      _Var19._M_current = __it._M_current + 1;
      if (bVar6) goto LAB_00112356;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<dxil_spv::Converter::Impl::create_bindless_heap_variable(dxil_spv::Converter::Impl::BindlessInfo_const&)::$_0>
              ::operator()((_Iter_pred<dxil_spv::Converter::Impl::create_bindless_heap_variable(dxil_spv::Converter::Impl::BindlessInfo_const&)::__0>
                            *)info,__it._M_current + 2);
      _Var19._M_current = __it._M_current + 2;
      if (bVar6) goto LAB_00112356;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<dxil_spv::Converter::Impl::create_bindless_heap_variable(dxil_spv::Converter::Impl::BindlessInfo_const&)::$_0>
              ::operator()((_Iter_pred<dxil_spv::Converter::Impl::create_bindless_heap_variable(dxil_spv::Converter::Impl::BindlessInfo_const&)::__0>
                            *)info,__it._M_current + 3);
      _Var19._M_current = __it._M_current + 3;
      if (bVar6) goto LAB_00112356;
      __it._M_current = __it._M_current + 4;
      lVar17 = lVar17 + -1;
    } while (1 < lVar17);
    lVar11 = (long)pBVar5 - (long)pBVar20;
    __it._M_current = pBVar20;
  }
  lVar11 = (lVar11 >> 3) * -0x3333333333333333;
  if (lVar11 == 1) {
LAB_0011233d:
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<dxil_spv::Converter::Impl::create_bindless_heap_variable(dxil_spv::Converter::Impl::BindlessInfo_const&)::$_0>
            ::operator()((_Iter_pred<dxil_spv::Converter::Impl::create_bindless_heap_variable(dxil_spv::Converter::Impl::BindlessInfo_const&)::__0>
                          *)info,__it);
    _Var19._M_current = __it._M_current;
    if (!bVar6) {
      _Var19._M_current = pBVar5;
    }
LAB_00112356:
    if (_Var19._M_current != pBVar5) {
      return (_Var19._M_current)->var_id;
    }
  }
  else {
    if (lVar11 == 2) {
LAB_0011232a:
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<dxil_spv::Converter::Impl::create_bindless_heap_variable(dxil_spv::Converter::Impl::BindlessInfo_const&)::$_0>
              ::operator()((_Iter_pred<dxil_spv::Converter::Impl::create_bindless_heap_variable(dxil_spv::Converter::Impl::BindlessInfo_const&)::__0>
                            *)info,__it);
      _Var19._M_current = __it._M_current;
      if (!bVar6) {
        __it._M_current = __it._M_current + 1;
        goto LAB_0011233d;
      }
      goto LAB_00112356;
    }
    if (lVar11 == 3) {
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<dxil_spv::Converter::Impl::create_bindless_heap_variable(dxil_spv::Converter::Impl::BindlessInfo_const&)::$_0>
              ::operator()((_Iter_pred<dxil_spv::Converter::Impl::create_bindless_heap_variable(dxil_spv::Converter::Impl::BindlessInfo_const&)::__0>
                            *)info,__it);
      _Var19._M_current = __it._M_current;
      if (!bVar6) {
        __it._M_current = __it._M_current + 1;
        goto LAB_0011232a;
      }
      goto LAB_00112356;
    }
  }
  local_1068.var_id = 0;
  local_1068.info.binding = info->binding;
  local_1068.info.type = info->type;
  local_1068.info.component = info->component;
  local_1068.info._2_2_ = *(undefined2 *)&info->field_0x2;
  local_1068.info.raw_vecsize = info->raw_vecsize;
  local_1068.info.kind = info->kind;
  local_1068.info._9_3_ = *(undefined3 *)&info->field_0x9;
  local_1068.info.format = info->format;
  local_1068.info.descriptor_type = info->descriptor_type;
  local_1068.info.uav_read = info->uav_read;
  local_1068.info.uav_written = info->uav_written;
  local_1068.info.uav_coherent = info->uav_coherent;
  local_1068.info.counters = info->counters;
  local_1068.info.offsets = info->offsets;
  local_1068.info.aliased = info->aliased;
  local_1068.info.relaxed_precision = info->relaxed_precision;
  local_1068.info._27_1_ = info->field_0x1b;
  local_1068.info.desc_set = info->desc_set;
  IVar8 = 0;
  switch(info->type) {
  case SRV:
    if (info->kind == RTAccelerationStructure) {
      if (info->descriptor_type == SSBO) {
        buffer._0_8_ = buffer + 0x10;
        std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>
        ::_M_construct<char_const*>
                  ((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>> *
                   )buffer,"RTASHeap","");
        IVar8 = build_ssbo_runtime_array_type(this,Integer,0x20,2,1,(String *)buffer);
        if ((char *)buffer._0_8_ != buffer + 0x10) {
          free_in_thread((void *)buffer._0_8_);
        }
        goto LAB_00112953;
      }
      pBVar12 = SPIRVModule::get_builder(this->spirv_module);
      IVar8 = spv::Builder::makeAccelerationStructureType(pBVar12);
      goto LAB_001124ad;
    }
    CVar7 = info->component;
    if (info->descriptor_type == SSBO) {
      uVar9 = CVar7 + 1;
      if ((0xb < (byte)uVar9) || ((0xf51U >> (uVar9 & 0x1f) & 1) == 0)) goto LAB_00112ef0;
      bVar16 = CVar7 + I1;
      if ((0xb < bVar16) || ((0xf51U >> (bVar16 & 0x1f) & 1) == 0)) goto LAB_00112f0f;
      RVar3 = *(RawType *)(&DAT_001bd564 + (ulong)(uVar9 & 0xff) * 4);
      uVar9 = *(uint *)(&DAT_001bd594 + (ulong)bVar16 * 4);
      if (info->offsets == true) {
        buffer._0_8_ = buffer + 0x10;
        std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>
        ::_M_construct<char_const*>
                  ((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>> *
                   )buffer,"SSBO_Offsets","");
        vecsize = 2;
        range_size = 1;
        uVar18 = 0x20;
      }
      else {
        vecsize = info->raw_vecsize + V2;
        buffer._0_8_ = buffer + 0x10;
        std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>
        ::_M_construct<char_const*>
                  ((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>> *
                   )buffer,"SSBO","");
        range_size = 0xffffffff;
        uVar18 = uVar9;
      }
      IVar8 = build_ssbo_runtime_array_type(this,RVar3,uVar18,vecsize,range_size,(String *)buffer);
      if ((char *)buffer._0_8_ != buffer + 0x10) {
        free_in_thread((void *)buffer._0_8_);
      }
      storage = StorageClassStorageBuffer;
      if (uVar9 == 8) {
LAB_00112bbd:
        pBVar12 = SPIRVModule::get_builder(this->spirv_module);
        spv::Builder::addExtension(pBVar12,"SPV_KHR_8bit_storage");
        pBVar12 = SPIRVModule::get_builder(this->spirv_module);
        buffer[0] = '`';
        buffer[1] = '\x11';
        buffer[2] = '\0';
        buffer[3] = '\0';
      }
      else {
        if (uVar9 != 0x10) break;
LAB_00112ba2:
        pBVar12 = SPIRVModule::get_builder(this->spirv_module);
        buffer[0] = 'Q';
        buffer[1] = '\x11';
        buffer[2] = '\0';
        buffer[3] = '\0';
      }
      storage = StorageClassStorageBuffer;
LAB_00112bf0:
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&pBVar12->capabilities,(Capability *)buffer);
    }
    else {
      if ((9 < CVar7) || ((0x230U >> (CVar7 & 0x1f) & 1) == 0)) {
        p_Var14 = get_thread_log_callback();
        if (p_Var14 == (LoggingCallback)0x0) {
          create_bindless_heap_variable();
          return 0;
        }
LAB_00112eae:
        builtin_strncpy(buffer,"Invalid component type for image.\n",0x23);
        pvVar15 = get_thread_log_callback_userdata();
        (*p_Var14)(pvVar15,Error,buffer);
        return 0;
      }
      IVar8 = get_type_id(this,CVar7,1,1,false);
      pBVar12 = SPIRVModule::get_builder(this->spirv_module);
      RVar2 = info->kind;
      dim = image_dimension_from_resource_kind(RVar2);
      bVar6 = (bool)((byte)(0x403c0 >> (RVar2 & (RTAccelerationStructure|TBuffer))) &
                    RVar2 < (FeedbackTexture2DArray|Texture1D));
      ms = RVar2 == Texture2DMS || RVar2 == Texture2DMSArray;
      format = ImageFormatUnknown;
      uVar9 = 1;
LAB_00112ae7:
      storage = StorageClassUniformConstant;
      IVar8 = spv::Builder::makeImageType(pBVar12,IVar8,dim,false,bVar6,ms,uVar9,format);
      pBVar12 = SPIRVModule::get_builder(this->spirv_module);
      IVar8 = spv::Builder::makeRuntimeArray(pBVar12,IVar8);
    }
    break;
  case UAV:
    if (info->counters == true) {
      pBVar12 = SPIRVModule::get_builder(this->spirv_module);
      IVar8 = spv::Builder::makeIntegerType(pBVar12,0x20,false);
      pBVar12 = SPIRVModule::get_builder(this->spirv_module);
      IVar8 = spv::Builder::makeVectorType(pBVar12,IVar8,2);
      pBVar12 = SPIRVModule::get_builder(this->spirv_module);
      IVar8 = spv::Builder::makeRuntimeArray(pBVar12,IVar8);
      pBVar12 = SPIRVModule::get_builder(this->spirv_module);
      spv::Builder::addDecoration(pBVar12,IVar8,DecorationArrayStride,8);
      buffer._0_8_ = allocate_in_thread(4);
      buffer._8_8_ = buffer._0_8_ + 4;
      *(Id *)buffer._0_8_ = IVar8;
      buffer._16_8_ = buffer._8_8_;
      IVar8 = get_struct_type(this,(Vector<spv::Id> *)buffer,0,"AtomicCounters");
      if (buffer._0_8_ != 0) {
        free_in_thread((void *)buffer._0_8_);
      }
      pBVar12 = SPIRVModule::get_builder(this->spirv_module);
      spv::Builder::addDecoration(pBVar12,IVar8,DecorationBlock,-1);
      pBVar12 = SPIRVModule::get_builder(this->spirv_module);
      spv::Builder::addMemberName(pBVar12,IVar8,0,"counters");
      pBVar12 = SPIRVModule::get_builder(this->spirv_module);
      spv::Builder::addMemberDecoration(pBVar12,IVar8,0,DecorationOffset,0);
      pBVar12 = SPIRVModule::get_builder(this->spirv_module);
      spv::Builder::addMemberDecoration(pBVar12,IVar8,0,DecorationNonWritable,-1);
LAB_00112953:
      storage = StorageClassStorageBuffer;
    }
    else {
      CVar7 = info->component;
      if (info->descriptor_type != SSBO) {
        if ((9 < CVar7) || ((0x2b0U >> (CVar7 & 0x1f) & 1) == 0)) {
          p_Var14 = get_thread_log_callback();
          if (p_Var14 == (LoggingCallback)0x0) {
            create_bindless_heap_variable();
            return 0;
          }
          goto LAB_00112eae;
        }
        IVar8 = get_type_id(this,CVar7,1,1,false);
        pBVar12 = SPIRVModule::get_builder(this->spirv_module);
        RVar2 = info->kind;
        dim = image_dimension_from_resource_kind(RVar2);
        bVar6 = (bool)((byte)(0x403c0 >> (RVar2 & (RTAccelerationStructure|TBuffer))) &
                      RVar2 < (FeedbackTexture2DArray|Texture1D));
        ms = RVar2 == Texture2DMS || RVar2 == Texture2DMSArray;
        format = info->format;
        uVar9 = 2;
        goto LAB_00112ae7;
      }
      uVar9 = CVar7 + 1;
      if ((0xb < (byte)uVar9) || ((0xf51U >> (uVar9 & 0x1f) & 1) == 0)) goto LAB_00112ef0;
      bVar16 = CVar7 + I1;
      if ((0xb < bVar16) || ((0xf51U >> (bVar16 & 0x1f) & 1) == 0)) goto LAB_00112f0f;
      RVar3 = *(RawType *)(&DAT_001bd564 + (ulong)(uVar9 & 0xff) * 4);
      uVar9 = *(uint *)(&DAT_001bd594 + (ulong)bVar16 * 4);
      RVar4 = info->raw_vecsize;
      buffer._0_8_ = buffer + 0x10;
      std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>> *)
                 buffer,"SSBO","");
      IVar8 = build_ssbo_runtime_array_type(this,RVar3,uVar9,RVar4 + V2,0xffffffff,(String *)buffer)
      ;
      if ((char *)buffer._0_8_ != buffer + 0x10) {
        free_in_thread((void *)buffer._0_8_);
      }
      storage = StorageClassStorageBuffer;
      if (uVar9 == 8) goto LAB_00112bbd;
      if (uVar9 == 0x10) goto LAB_00112ba2;
    }
    break;
  case CBV:
    bVar16 = info->component + I1;
    if (0xb < bVar16) {
LAB_00112ef0:
      __assert_fail("0 && \"Invalid component type.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/opcodes/converter_impl.hpp"
                    ,0x8d,"RawType dxil_spv::raw_component_type_to_type(DXIL::ComponentType)");
    }
    if ((0xf51U >> (bVar16 & 0x1f) & 1) == 0) goto LAB_00112ef0;
    if ((0xb < bVar16) || ((0xf51U >> (bVar16 & 0x1f) & 1) == 0)) {
LAB_00112f0f:
      __assert_fail("0 && \"Invalid component type.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/opcodes/converter_impl.hpp"
                    ,0x7a,"unsigned int dxil_spv::raw_component_type_to_bits(DXIL::ComponentType)");
    }
    uVar9 = *(uint *)(&DAT_001bd594 + (ulong)bVar16 * 4);
    uVar18 = info->raw_vecsize + V2;
    pBVar12 = SPIRVModule::get_builder(this->spirv_module);
    if ((0x1ffU >> (bVar16 & 0x1f) & 1) == 0) {
      IVar8 = spv::Builder::makeFloatType(pBVar12,uVar9);
    }
    else {
      IVar8 = spv::Builder::makeIntegerType(pBVar12,uVar9,false);
    }
    if (1 < uVar18) {
      pBVar12 = SPIRVModule::get_builder(this->spirv_module);
      IVar8 = spv::Builder::makeVectorType(pBVar12,IVar8,uVar18);
    }
    uVar18 = uVar18 * (uVar9 >> 3);
    pBVar12 = SPIRVModule::get_builder(this->spirv_module);
    this_00 = SPIRVModule::get_builder(this->spirv_module);
    IVar10 = spv::Builder::makeIntegerType(this_00,0x20,false);
    IVar10 = spv::Builder::makeIntConstant(this_00,IVar10,(uint)(0x10000 / (ulong)uVar18),false);
    IVar8 = spv::Builder::makeArrayType(pBVar12,IVar8,IVar10,uVar18);
    pBVar12 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addDecoration(pBVar12,IVar8,DecorationArrayStride,uVar18);
    buffer._0_8_ = allocate_in_thread(4);
    buffer._8_8_ = buffer._0_8_ + 4;
    *(Id *)buffer._0_8_ = IVar8;
    buffer._16_8_ = buffer._8_8_;
    IVar8 = get_struct_type(this,(Vector<spv::Id> *)buffer,0,"BindlessCBV");
    if (buffer._0_8_ != 0) {
      free_in_thread((void *)buffer._0_8_);
    }
    pBVar12 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addDecoration(pBVar12,IVar8,DecorationBlock,-1);
    if ((this->options).bindless_cbv_ssbo_emulation == true) {
      pBVar12 = SPIRVModule::get_builder(this->spirv_module);
      spv::Builder::addMemberDecoration(pBVar12,IVar8,0,DecorationNonWritable,-1);
    }
    pBVar12 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addMemberDecoration(pBVar12,IVar8,0,DecorationOffset,0);
    pBVar12 = SPIRVModule::get_builder(this->spirv_module);
    IVar8 = spv::Builder::makeRuntimeArray(pBVar12,IVar8);
    bVar6 = (this->options).bindless_cbv_ssbo_emulation;
    storage = StorageClassUniform;
    if (bVar6 != false) {
      storage = StorageClassStorageBuffer;
    }
    if (uVar9 == 8) {
      pBVar12 = SPIRVModule::get_builder(this->spirv_module);
      spv::Builder::addExtension(pBVar12,"SPV_KHR_8bit_storage");
      bVar6 = (this->options).bindless_cbv_ssbo_emulation;
      pBVar12 = SPIRVModule::get_builder(this->spirv_module);
      if (bVar6 == true) {
        buffer[0] = '`';
        buffer[1] = '\x11';
        buffer[2] = '\0';
        buffer[3] = '\0';
      }
      else {
        buffer[0] = 'a';
        buffer[1] = '\x11';
        buffer[2] = '\0';
        buffer[3] = '\0';
      }
      goto LAB_00112bf0;
    }
    if (uVar9 == 0x10) {
      pBVar12 = SPIRVModule::get_builder(this->spirv_module);
      if (bVar6 != false) {
        buffer[0] = 'Q';
        buffer[1] = '\x11';
        buffer[2] = '\0';
        buffer[3] = '\0';
        std::
        _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
        ::_M_insert_unique<spv::Capability_const&>
                  ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                    *)&pBVar12->capabilities,(Capability *)buffer);
        goto LAB_00112953;
      }
      buffer[0] = 'R';
      buffer[1] = '\x11';
      buffer[2] = '\0';
      buffer[3] = '\0';
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&pBVar12->capabilities,(Capability *)buffer);
      storage = StorageClassUniform;
    }
    break;
  case Sampler:
    pBVar12 = SPIRVModule::get_builder(this->spirv_module);
    IVar8 = spv::Builder::makeSamplerType(pBVar12);
LAB_001124ad:
    pBVar12 = SPIRVModule::get_builder(this->spirv_module);
    IVar8 = spv::Builder::makeRuntimeArray(pBVar12,IVar8);
    storage = StorageClassUniformConstant;
    break;
  default:
    goto switchD_001123a5_default;
  }
  pBVar12 = SPIRVModule::get_builder(this->spirv_module);
  spv::Builder::addExtension(pBVar12,"SPV_EXT_descriptor_indexing");
  pBVar12 = SPIRVModule::get_builder(this->spirv_module);
  buffer[0] = -0x4a;
  buffer[1] = '\x14';
  buffer[2] = '\0';
  buffer[3] = '\0';
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
              *)&pBVar12->capabilities,(Capability *)buffer);
  local_1068.var_id = SPIRVModule::create_variable(this->spirv_module,storage,IVar8,(char *)0x0);
  pmVar13 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->handle_to_resource_meta,&local_1068.var_id);
  pmVar13->kind = Invalid;
  pmVar13->component_type = Invalid;
  pmVar13->raw_component_vecsize = V1;
  pmVar13->stride = 0;
  pmVar13->var_id = 0;
  ptr = (pmVar13->var_alias_group).
        super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ._M_impl.super__Vector_impl_data._M_start;
  (pmVar13->var_alias_group).
  super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pmVar13->var_alias_group).
  super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar13->var_alias_group).
  super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (ptr != (pointer)0x0) {
    free_in_thread(ptr);
  }
  pmVar13->aliased = false;
  pmVar13->non_uniform = false;
  pmVar13->counter_is_physical_pointer = false;
  pmVar13->rov = false;
  pmVar13->storage = StorageClassUniformConstant;
  pmVar13->counter_var_id = 0;
  (pmVar13->physical_pointer_meta).nonwritable = false;
  (pmVar13->physical_pointer_meta).nonreadable = false;
  (pmVar13->physical_pointer_meta).coherent = false;
  (pmVar13->physical_pointer_meta).rov = false;
  (pmVar13->physical_pointer_meta).stride = '\0';
  *(undefined8 *)&(pmVar13->physical_pointer_meta).size = 0;
  (pmVar13->instrumentation).bda_id = 0;
  (pmVar13->instrumentation).elem_size_id = 0;
  (pmVar13->instrumentation).resource_size_id = 0;
  pmVar13->kind = info->kind;
  pmVar13->component_type = info->component;
  pmVar13->raw_component_vecsize = info->raw_vecsize;
  pmVar13->var_id = local_1068.var_id;
  pmVar13->storage = storage;
  pBVar12 = SPIRVModule::get_builder(this->spirv_module);
  spv::Builder::addDecoration(pBVar12,local_1068.var_id,DecorationDescriptorSet,info->desc_set);
  pBVar12 = SPIRVModule::get_builder(this->spirv_module);
  spv::Builder::addDecoration(pBVar12,local_1068.var_id,DecorationBinding,info->binding);
  if (info->relaxed_precision == true) {
    pBVar12 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addDecoration(pBVar12,local_1068.var_id,DecorationRelaxedPrecision,-1);
    CVar7 = pmVar13->component_type;
    if (CVar7 == F32) {
      CVar7 = F16;
    }
    else if (CVar7 == U32) {
      CVar7 = U16;
    }
    else {
      if (CVar7 != I32) goto LAB_00112d3c;
      CVar7 = I16;
    }
    pmVar13->component_type = CVar7;
  }
LAB_00112d3c:
  if ((info->type == UAV) && ((info->counters & 1U) == 0)) {
    if (info->uav_read == false) {
      pBVar12 = SPIRVModule::get_builder(this->spirv_module);
      spv::Builder::addDecoration(pBVar12,local_1068.var_id,DecorationNonReadable,-1);
    }
    if (info->uav_written == false) {
      pBVar12 = SPIRVModule::get_builder(this->spirv_module);
      spv::Builder::addDecoration(pBVar12,local_1068.var_id,DecorationNonWritable,-1);
    }
    decoration = DecorationCoherent;
    if (info->uav_coherent != false) goto LAB_00112deb;
  }
  else {
    decoration = DecorationAliasedPointer;
    if ((info->counters & 1U) == 0) {
      if ((info->type != SRV) || (info->descriptor_type != SSBO)) goto LAB_00112e07;
      pBVar12 = SPIRVModule::get_builder(this->spirv_module);
      spv::Builder::addDecoration(pBVar12,local_1068.var_id,DecorationNonWritable,-1);
      decoration = DecorationRestrict;
    }
LAB_00112deb:
    pBVar12 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addDecoration(pBVar12,local_1068.var_id,decoration,-1);
  }
LAB_00112e07:
  if ((info->aliased == true) && (info->type == UAV)) {
    pBVar12 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addDecoration(pBVar12,local_1068.var_id,DecorationAliased,-1);
  }
  __position._M_current =
       (this->bindless_resources).
       super__Vector_base<dxil_spv::Converter::Impl::BindlessResource,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->bindless_resources).
      super__Vector_base<dxil_spv::Converter::Impl::BindlessResource,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<dxil_spv::Converter::Impl::BindlessResource,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>>
    ::_M_realloc_insert<dxil_spv::Converter::Impl::BindlessResource_const&>
              ((vector<dxil_spv::Converter::Impl::BindlessResource,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>>
                *)&this->bindless_resources,__position,&local_1068);
    IVar8 = local_1068.var_id;
  }
  else {
    *(ulong *)&((__position._M_current)->info).binding =
         CONCAT44(local_1068.var_id,local_1068.info.binding);
    ((__position._M_current)->info).descriptor_type = local_1068.info.descriptor_type;
    ((__position._M_current)->info).uav_read = (bool)local_1068.info.uav_read;
    ((__position._M_current)->info).uav_written = (bool)local_1068.info.uav_written;
    ((__position._M_current)->info).uav_coherent = (bool)local_1068.info.uav_coherent;
    ((__position._M_current)->info).counters = (bool)local_1068.info.counters;
    ((__position._M_current)->info).offsets = (bool)local_1068.info.offsets;
    ((__position._M_current)->info).aliased = (bool)local_1068.info.aliased;
    ((__position._M_current)->info).relaxed_precision = (bool)local_1068.info.relaxed_precision;
    ((__position._M_current)->info).field_0x1b = local_1068.info._27_1_;
    ((__position._M_current)->info).desc_set = local_1068.info.desc_set;
    ((__position._M_current)->info).type = local_1068.info.type;
    ((__position._M_current)->info).component = local_1068.info.component;
    *(short *)&((__position._M_current)->info).field_0x2 = local_1068.info._2_2_;
    ((__position._M_current)->info).raw_vecsize = local_1068.info.raw_vecsize;
    ((__position._M_current)->info).kind = local_1068.info.kind;
    *(int3 *)&((__position._M_current)->info).field_0x9 = local_1068.info._9_3_;
    ((__position._M_current)->info).format = local_1068.info.format;
    ppBVar1 = &(this->bindless_resources).
               super__Vector_base<dxil_spv::Converter::Impl::BindlessResource,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppBVar1 = *ppBVar1 + 1;
    IVar8 = local_1068.var_id;
  }
switchD_001123a5_default:
  return IVar8;
}

Assistant:

spv::Id Converter::Impl::create_bindless_heap_variable(const BindlessInfo &info)
{
	auto itr = std::find_if(bindless_resources.begin(), bindless_resources.end(), [&](const BindlessResource &resource) {
		return
			resource.info.type == info.type &&
			resource.info.component == info.component &&
			resource.info.raw_vecsize == info.raw_vecsize &&
			resource.info.kind == info.kind &&
			resource.info.desc_set == info.desc_set &&
			resource.info.format == info.format &&
			resource.info.binding == info.binding &&
			resource.info.uav_read == info.uav_read &&
			resource.info.uav_written == info.uav_written &&
			resource.info.uav_coherent == info.uav_coherent &&
			resource.info.relaxed_precision == info.relaxed_precision &&
			resource.info.aliased == info.aliased &&
			resource.info.counters == info.counters &&
			resource.info.offsets == info.offsets &&
			resource.info.descriptor_type == info.descriptor_type;
	});

	if (itr != bindless_resources.end())
	{
		return itr->var_id;
	}
	else
	{
		BindlessResource resource = {};
		resource.info = info;

		spv::Id type_id = 0;
		auto storage = spv::StorageClassMax;

		switch (info.type)
		{
		case DXIL::ResourceType::SRV:
		{
			if (info.kind == DXIL::ResourceKind::RTAccelerationStructure)
			{
				if (info.descriptor_type == VulkanDescriptorType::SSBO)
				{
					type_id = build_ssbo_runtime_array_type(*this, RawType::Integer, 32, 2, 1, "RTASHeap");
					storage = spv::StorageClassStorageBuffer;
				}
				else
				{
					type_id = builder().makeAccelerationStructureType();
					type_id = builder().makeRuntimeArray(type_id);
					storage = spv::StorageClassUniformConstant;
				}
			}
			else if (info.descriptor_type == VulkanDescriptorType::SSBO)
			{
				RawType raw_type = raw_component_type_to_type(info.component);
				unsigned bits = raw_component_type_to_bits(info.component);

				if (info.offsets)
					type_id = build_ssbo_runtime_array_type(*this, raw_type, 32, 2, 1, "SSBO_Offsets");
				else
					type_id = build_ssbo_runtime_array_type(*this, raw_type, bits, raw_vecsize_to_vecsize(info.raw_vecsize),
					                                        ~0u, "SSBO");
				storage = spv::StorageClassStorageBuffer;
				if (bits == 16)
					builder().addCapability(spv::CapabilityStorageBuffer16BitAccess);
				else if (bits == 8)
				{
					builder().addExtension("SPV_KHR_8bit_storage");
					builder().addCapability(spv::CapabilityStorageBuffer8BitAccess);
				}
			}
			else
			{
				if (info.component != DXIL::ComponentType::U32 &&
				    info.component != DXIL::ComponentType::I32 &&
				    info.component != DXIL::ComponentType::F32)
				{
					LOGE("Invalid component type for image.\n");
					return 0;
				}

				spv::Id sampled_type_id = get_type_id(info.component, 1, 1);
				type_id = builder().makeImageType(sampled_type_id, image_dimension_from_resource_kind(info.kind), false,
				                                  image_dimension_is_arrayed(info.kind),
				                                  image_dimension_is_multisampled(info.kind), 1, spv::ImageFormatUnknown);
				type_id = builder().makeRuntimeArray(type_id);
				storage = spv::StorageClassUniformConstant;
			}
			break;
		}

		case DXIL::ResourceType::UAV:
		{
			if (info.counters)
			{
				spv::Id uint_type = builder().makeUintType(32);
				spv::Id uvec2_type = builder().makeVectorType(uint_type, 2);

				spv::Id runtime_array_type_id = builder().makeRuntimeArray(uvec2_type);
				builder().addDecoration(runtime_array_type_id, spv::DecorationArrayStride, sizeof(uint64_t));

				type_id = get_struct_type({ runtime_array_type_id }, 0, "AtomicCounters");
				builder().addDecoration(type_id, spv::DecorationBlock);
				builder().addMemberName(type_id, 0, "counters");
				builder().addMemberDecoration(type_id, 0, spv::DecorationOffset, 0);
				builder().addMemberDecoration(type_id, 0, spv::DecorationNonWritable);
				storage = spv::StorageClassStorageBuffer;
			}
			else if (info.descriptor_type == VulkanDescriptorType::SSBO)
			{
				RawType raw_type = raw_component_type_to_type(info.component);
				unsigned bits = raw_component_type_to_bits(info.component);

				type_id = build_ssbo_runtime_array_type(*this, raw_type, bits, raw_vecsize_to_vecsize(info.raw_vecsize),
				                                        ~0u, "SSBO");
				storage = spv::StorageClassStorageBuffer;
				if (bits == 16)
					builder().addCapability(spv::CapabilityStorageBuffer16BitAccess);
				else if (bits == 8)
				{
					builder().addExtension("SPV_KHR_8bit_storage");
					builder().addCapability(spv::CapabilityStorageBuffer8BitAccess);
				}
			}
			else
			{
				if (info.component != DXIL::ComponentType::U32 &&
				    info.component != DXIL::ComponentType::I32 &&
				    info.component != DXIL::ComponentType::F32 &&
				    info.component != DXIL::ComponentType::U64)
				{
					LOGE("Invalid component type for image.\n");
					return 0;
				}

				spv::Id sampled_type_id = get_type_id(info.component, 1, 1);
				type_id = builder().makeImageType(sampled_type_id, image_dimension_from_resource_kind(info.kind), false,
				                                  image_dimension_is_arrayed(info.kind),
				                                  image_dimension_is_multisampled(info.kind), 2, info.format);
				type_id = builder().makeRuntimeArray(type_id);
				storage = spv::StorageClassUniformConstant;
			}
			break;
		}

		case DXIL::ResourceType::Sampler:
			type_id = builder().makeSamplerType();
			type_id = builder().makeRuntimeArray(type_id);
			storage = spv::StorageClassUniformConstant;
			break;

		case DXIL::ResourceType::CBV:
		{
			RawType raw_type = raw_component_type_to_type(info.component);
			unsigned bits = raw_component_type_to_bits(info.component);

			unsigned vecsize = raw_vecsize_to_vecsize(info.raw_vecsize);
			type_id = raw_type == RawType::Float ? builder().makeFloatType(bits) : builder().makeUintType(bits);
			if (vecsize > 1)
				type_id = builder().makeVectorType(type_id, vecsize);

			unsigned element_size = (bits / 8) * vecsize;
			unsigned num_elements = 0x10000 / element_size;

			type_id = builder().makeArrayType(type_id, builder().makeUintConstant(num_elements), element_size);
			builder().addDecoration(type_id, spv::DecorationArrayStride, element_size);
			type_id = get_struct_type({ type_id }, 0, "BindlessCBV");
			builder().addDecoration(type_id, spv::DecorationBlock);
			if (options.bindless_cbv_ssbo_emulation)
				builder().addMemberDecoration(type_id, 0, spv::DecorationNonWritable);
			builder().addMemberDecoration(type_id, 0, spv::DecorationOffset, 0);
			type_id = builder().makeRuntimeArray(type_id);
			storage = options.bindless_cbv_ssbo_emulation ? spv::StorageClassStorageBuffer : spv::StorageClassUniform;

			if (bits == 16)
			{
				if (options.bindless_cbv_ssbo_emulation)
					builder().addCapability(spv::CapabilityStorageBuffer16BitAccess);
				else
					builder().addCapability(spv::CapabilityUniformAndStorageBuffer16BitAccess);
			}
			else if (bits == 8)
			{
				builder().addExtension("SPV_KHR_8bit_storage");
				if (options.bindless_cbv_ssbo_emulation)
					builder().addCapability(spv::CapabilityStorageBuffer8BitAccess);
				else
					builder().addCapability(spv::CapabilityUniformAndStorageBuffer8BitAccess);
			}
			break;
		}

		default:
			return 0;
		}

		builder().addExtension("SPV_EXT_descriptor_indexing");
		builder().addCapability(spv::CapabilityRuntimeDescriptorArrayEXT);
		resource.var_id = create_variable(storage, type_id);

		auto &meta = handle_to_resource_meta[resource.var_id];
		meta = {};
		meta.kind = info.kind;
		meta.component_type = info.component;
		meta.raw_component_vecsize = info.raw_vecsize;
		meta.var_id = resource.var_id;
		meta.storage = storage;

		builder().addDecoration(resource.var_id, spv::DecorationDescriptorSet, info.desc_set);
		builder().addDecoration(resource.var_id, spv::DecorationBinding, info.binding);

		if (info.relaxed_precision)
		{
			builder().addDecoration(resource.var_id, spv::DecorationRelaxedPrecision);

			// Signal the intended component type.
			switch (meta.component_type)
			{
			case DXIL::ComponentType::F32:
				meta.component_type = DXIL::ComponentType::F16;
				break;

			case DXIL::ComponentType::I32:
				meta.component_type = DXIL::ComponentType::I16;
				break;

			case DXIL::ComponentType::U32:
				meta.component_type = DXIL::ComponentType::U16;
				break;

			default:
				break;
			}
		}

		if (info.type == DXIL::ResourceType::UAV && !info.counters)
		{
			if (!info.uav_read)
				builder().addDecoration(resource.var_id, spv::DecorationNonReadable);
			if (!info.uav_written)
				builder().addDecoration(resource.var_id, spv::DecorationNonWritable);
			if (info.uav_coherent)
				builder().addDecoration(resource.var_id, spv::DecorationCoherent);
		}
		else if (info.counters)
		{
			builder().addDecoration(resource.var_id, spv::DecorationAliasedPointer);
		}
		else if (info.type == DXIL::ResourceType::SRV && info.descriptor_type == VulkanDescriptorType::SSBO)
		{
			builder().addDecoration(resource.var_id, spv::DecorationNonWritable);
			builder().addDecoration(resource.var_id, spv::DecorationRestrict);
		}

		// The default in Vulkan environment is Restrict.
		if (info.aliased && info.type == DXIL::ResourceType::UAV)
			builder().addDecoration(resource.var_id, spv::DecorationAliased);

		bindless_resources.push_back(resource);
		return resource.var_id;
	}
}